

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagProbe.cpp
# Opt level: O3

void __thiscall Js::StepController::StepController(StepController *this)

{
  this->stepType = STEP_NONE;
  *(undefined8 *)&this->byteOffset = 0;
  *(undefined8 *)((long)&(this->body).ptr + 4) = 0;
  this->statementMap = (StatementMap *)0x0;
  this->frameCountWhenSet = 0;
  this->returnedValueRecordingDepth = 0;
  this->frameAddrWhenSet = 0xffffffffffffffff;
  this->scriptIdWhenSet = 0xffffffff;
  this->stepCompleteOnInlineBreakpoint = false;
  this->pActivatedContext = (ScriptContext *)0x0;
  this->returnedValueList = (ReturnedValueList *)0x0;
  return;
}

Assistant:

StepController::StepController()
        : stepType(STEP_NONE),
        byteOffset(0),
        statementMap(NULL),
        frameCountWhenSet(0),
        frameAddrWhenSet((size_t)-1),
        stepCompleteOnInlineBreakpoint(false),
        pActivatedContext(NULL),
        scriptIdWhenSet(InvalidScriptId),
        returnedValueRecordingDepth(0),
        returnedValueList(nullptr)
    {
    }